

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_enc.c
# Opt level: O3

void jpc_enc_tile_destroy(jpc_enc_tile_t *tile)

{
  jpc_enc_tcmpt_t *tcmpt;
  ulong uVar1;
  
  tcmpt = tile->tcmpts;
  if (tcmpt != (jpc_enc_tcmpt_t *)0x0) {
    if (tile->numtcmpts != 0) {
      uVar1 = 0;
      do {
        tcmpt_destroy(tcmpt);
        uVar1 = uVar1 + 1;
        tcmpt = tcmpt + 1;
      } while (uVar1 < tile->numtcmpts);
      tcmpt = tile->tcmpts;
    }
    jas_free(tcmpt);
  }
  if (tile->lyrsizes != (uint_fast32_t *)0x0) {
    jas_free(tile->lyrsizes);
  }
  if (tile->pi != (jpc_pi_t *)0x0) {
    jpc_pi_destroy(tile->pi);
  }
  jas_free(tile);
  return;
}

Assistant:

static void jpc_enc_tile_destroy(jpc_enc_tile_t *tile)
{
	jpc_enc_tcmpt_t *tcmpt;
	uint_fast16_t cmptno;

	if (tile->tcmpts) {
		for (cmptno = 0, tcmpt = tile->tcmpts; cmptno <
		  tile->numtcmpts; ++cmptno, ++tcmpt) {
			tcmpt_destroy(tcmpt);
		}
		jas_free(tile->tcmpts);
		/* tile->tcmpts = NULL; */
	}
	if (tile->lyrsizes) {
		jas_free(tile->lyrsizes);
		/* tile->lyrsizes = NULL; */
	}
	if (tile->pi) {
		jpc_pi_destroy(tile->pi);
		/* tile->pi = NULL; */
	}
	jas_free(tile);
	/* tile = NULL; */
}